

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetra-codec-impl.c
# Opt level: O1

Word32 L_shr(tetra_codec *st,Word32 L_var1,Word16 var2)

{
  Word32 WVar1;
  uint uVar2;
  
  if (-1 < var2) {
    if (var2 < 0x1f) {
      if (L_var1 < 0) {
        uVar2 = L_var1 >> ((byte)var2 & 0x1f);
      }
      else {
        uVar2 = (uint)L_var1 >> ((byte)var2 & 0x1f);
      }
    }
    else {
      uVar2 = L_var1 >> 0x1f;
    }
    return uVar2;
  }
  WVar1 = L_shl(st,L_var1,-var2);
  return WVar1;
}

Assistant:

Word32 L_shr(tetra_codec* st, Word32 L_var1, Word16 var2)
  {
   Word32 L_var_out;

   if (var2 < 0)
     {
      L_var_out = L_shl(st, L_var1,(Word16)(-var2) );
     }
   else
     {
      if (var2 >= 31)
 {
  L_var_out = (L_var1 < 0L) ? -1 : 0;
 }
      else
 {
  if (L_var1<0)
    {
     L_var_out = ~((~L_var1) >> var2);
    }
  else
    {
     L_var_out = L_var1 >> var2;
    }
 }
     }
   return(L_var_out);
  }